

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_tests.cpp
# Opt level: O2

void (anonymous_namespace)::test_concat<true,5>(uint32_t sz)

{
  int val;
  int iVar1;
  int *piVar2;
  uint32_t j;
  uint32_t index;
  uint uVar3;
  uint32_t uVar4;
  vector<int,_true,_5> catted;
  vector<int,_true,_5> v2;
  vector<int,_true,_5> v1;
  
  immutable::rrb_create<int,true,5>();
  immutable::rrb_create<int,true,5>();
  uVar4 = 2;
  iVar1 = -1;
  uVar3 = 0;
  while (uVar3 != sz) {
    rand();
    immutable::vector<int,_true,_5>::push_back(&catted,(value_type_conflict)&v1);
    immutable::ref<immutable::rrb<int,_true,_5>_>::operator=(&v1._impl,&catted._impl);
    immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&catted._impl);
    rand();
    immutable::vector<int,_true,_5>::push_back(&catted,(value_type_conflict)&v2);
    immutable::ref<immutable::rrb<int,_true,_5>_>::operator=(&v2._impl,&catted._impl);
    immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&catted._impl);
    immutable::operator+((immutable *)&catted,&v1,&v2);
    for (index = 0; uVar4 != index; index = index + 1) {
      piVar2 = immutable::rrb_nth<int,true,5>(&catted._impl,index);
      val = *piVar2;
      if (uVar3 < index) {
        piVar2 = immutable::rrb_nth<int,true,5>(&v2._impl,iVar1 + index);
        TestEq<int,int>(*piVar2,val,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0x123,
                        "void (anonymous namespace)::test_concat(uint32_t) [atomic_ref_counting = true, N = 5]"
                       );
      }
      else {
        piVar2 = immutable::rrb_nth<int,true,5>(&v1._impl,index);
        TestEq<int,int>(*piVar2,val,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0x11e,
                        "void (anonymous namespace)::test_concat(uint32_t) [atomic_ref_counting = true, N = 5]"
                       );
      }
    }
    immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&catted._impl);
    uVar4 = uVar4 + 2;
    iVar1 = iVar1 + -1;
    uVar3 = uVar3 + 1;
  }
  immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&v2._impl);
  immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&v1._impl);
  return;
}

Assistant:

void test_concat(uint32_t sz = 2000)
    {
    immutable::vector<int, atomic_ref_counting, N> v1;
    immutable::vector<int, atomic_ref_counting, N> v2;
    for (uint32_t i = 0; i < sz; ++i)
      {
      v1 = v1.push_back((int)rand());
      v2 = v2.push_back((int)rand());

      immutable::vector<int, atomic_ref_counting, N> catted = v1 + v2;

      for (uint32_t j = 0; j < (i + 1) * 2; j++)
        {
        int val_cat = catted[j];
        if (j <= i)
          {
          int val1 = v1[j];
          TEST_EQ(val1, val_cat);
          }
        else
          {
          int val2 = v2[j - i - 1];
          TEST_EQ(val2, val_cat);
          }
        }
      }
    }